

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O0

GLuint deqp::gls::MultiTextureSamplerTest::createTexture2D(Functions *gl,int id)

{
  glTexImage2DFunc p_Var1;
  GLuint GVar2;
  GLenum GVar3;
  int iVar4;
  int iVar5;
  PixelBufferAccess *pPVar6;
  void *pvVar7;
  Vector<float,_4> local_bc;
  Vector<float,_4> local_ac;
  Vector<float,_4> local_9c;
  Vector<float,_4> local_8c;
  TextureFormat local_70;
  undefined1 local_68 [8];
  Texture2D refTexture;
  GLuint texture;
  int id_local;
  Functions *gl_local;
  
  refTexture.m_view.m_levels._0_4_ = 0xffffffff;
  refTexture.m_view.m_levels._4_4_ = id;
  tcu::TextureFormat::TextureFormat(&local_70,RGBA,UNORM_INT8);
  tcu::Texture2D::Texture2D((Texture2D *)local_68,&local_70,0x20,0x20);
  tcu::Texture2D::allocLevel((Texture2D *)local_68,0);
  (*gl->genTextures)(1,(GLuint *)&refTexture.m_view.m_levels);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGenTextures(1, &texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x374);
  if (refTexture.m_view.m_levels._4_4_ == 0) {
    pPVar6 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_68,0);
    tcu::Vector<float,_4>::Vector(&local_8c,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_9c,1.0,1.0,0.5,0.5);
    tcu::fillWithComponentGradients(pPVar6,&local_8c,&local_9c);
  }
  else if (refTexture.m_view.m_levels._4_4_ == 1) {
    pPVar6 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_68,0);
    tcu::Vector<float,_4>::Vector(&local_ac,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_bc,0.5,0.5,1.0,1.0);
    tcu::fillWithComponentGradients(pPVar6,&local_ac,&local_bc);
  }
  (*gl->bindTexture)(0xde1,(GLuint)refTexture.m_view.m_levels);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture(GL_TEXTURE_2D, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x385);
  p_Var1 = gl->texImage2D;
  iVar4 = tcu::Texture2D::getWidth((Texture2D *)local_68);
  iVar5 = tcu::Texture2D::getHeight((Texture2D *)local_68);
  pPVar6 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_68,0);
  pvVar7 = tcu::PixelBufferAccess::getDataPtr(pPVar6);
  (*p_Var1)(0xde1,0,0x8058,iVar4,iVar5,0,0x1908,0x1401,pvVar7);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,
                  "glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x388);
  (*gl->generateMipmap)(0xde1);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGenerateMipmap(GL_TEXTURE_2D)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x38b);
  (*gl->bindTexture)(0xde1,0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture(GL_TEXTURE_2D, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x38e);
  GVar2 = (GLuint)refTexture.m_view.m_levels;
  tcu::Texture2D::~Texture2D((Texture2D *)local_68);
  return GVar2;
}

Assistant:

GLuint MultiTextureSamplerTest::createTexture2D (const glw::Functions& gl, int id)
{
	GLuint			texture		= (GLuint)-1;
	tcu::Texture2D	refTexture	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), TEXTURE2D_WIDTH, TEXTURE2D_HEIGHT);

	refTexture.allocLevel(0);

	gl.genTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures(1, &texture)");

	switch (id)
	{
		case 0:
			tcu::fillWithComponentGradients(refTexture.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 0.5f, 0.5f));
			break;

		case 1:
			tcu::fillWithComponentGradients(refTexture.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 1.0f, 1.0f));
			break;

		default:
			DE_ASSERT(false);
	}

	gl.bindTexture(GL_TEXTURE_2D, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_2D, texture)");

	gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr())");

	gl.generateMipmap(GL_TEXTURE_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap(GL_TEXTURE_2D)");

	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_2D, 0)");

	return texture;
}